

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::expr<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool bVar1;
  Err local_68;
  Err *local_48;
  Err *err;
  Result<wasm::Ok> _val;
  ParseDeclsCtx *ctx_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = ctx;
  instrs<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)&err,ctx);
  local_48 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_48 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err(&local_68,local_48);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_68);
    wasm::Err::~Err(&local_68);
  }
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (bVar1) {
    NullInstrParserCtx::makeExpr
              (__return_storage_ptr__,
               (NullInstrParserCtx *)
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::ExprT> expr(Ctx& ctx) {
  CHECK_ERR(instrs(ctx));
  return ctx.makeExpr();
}